

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O3

void V_unite_cube_extraction
               (tetgenio *out,int *draw_check,double *total_distance,double *draw_points,
               int *draw_check_array,int *num_draw_points,float *x1,float *y1,float *z1,float *x2,
               float *y2,float *z2,int *draw_index,int *point_index)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  voroedge *pvVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar11;
  double *pdVar12;
  long lVar13;
  int iVar14;
  double *pdVar15;
  double *pdVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  int local_34;
  
  *total_distance = 0.0;
  *draw_index = 0;
  *point_index = 0;
  *num_draw_points = 0;
  iVar14 = out->numberofvedges;
  if (0 < iVar14) {
    lVar17 = 0x10;
    lVar13 = 0;
    do {
      pdVar12 = out->vpointlist;
      pvVar7 = out->vedgelist;
      lVar11 = (long)*(int *)((long)pvVar7->vnormal + lVar17 + -0x18);
      *x1 = (float)pdVar12[lVar11 * 3];
      *y1 = (float)pdVar12[lVar11 * 3 + 1];
      *z1 = (float)pdVar12[lVar11 * 3 + 2];
      iVar6 = *(int *)((long)pvVar7->vnormal + lVar17 + -0x14);
      lVar11 = (long)iVar6;
      bVar18 = lVar11 == -1;
      pdVar16 = pdVar12 + lVar11 * 3;
      if (bVar18) {
        pdVar16 = (double *)((long)pvVar7->vnormal + lVar17 + -0x10);
      }
      pdVar15 = pdVar12 + lVar11 * 3 + 1;
      if (bVar18) {
        pdVar15 = (double *)((long)pvVar7->vnormal + lVar17 + -8);
      }
      pdVar12 = pdVar12 + lVar11 * 3 + 2;
      if (bVar18) {
        pdVar12 = (double *)((long)pvVar7->vnormal + lVar17);
      }
      dVar20 = *pdVar15;
      *x2 = (float)*pdVar16;
      *y2 = (float)dVar20;
      fVar19 = (float)*pdVar12;
      *z2 = fVar19;
      fVar1 = *x1;
      if (((((((fVar1 <= 1.0) && (*y1 <= 1.0)) && (0.0 <= *z1)) && ((0.0 <= *y1 && (0.0 <= fVar1))))
           && (*z1 <= 1.0)) ||
          (((*x2 <= 1.0 && (*y2 <= 1.0)) &&
           ((0.0 <= fVar19 && (((fVar19 <= 1.0 && (0.0 <= *x2)) && (0.0 <= *y2)))))))) &&
         ((iVar6 != -1 ||
          ((((fVar1 < 1.0 && (*y1 < 1.0)) && ((0.0 < *z1 && ((0.0 < *y1 && (0.0 < fVar1)))))) &&
           (*z1 < 1.0)))))) {
        trim(x1,y1,z1,x2,y2,z2,&local_34,draw_check);
        fVar1 = *y1;
        fVar19 = *x1;
        fVar2 = *x2;
        fVar3 = *z1;
        fVar4 = *z2;
        fVar5 = *y2;
        dVar20 = (double)fVar2 - (double)fVar19;
        dVar22 = (double)fVar5 - (double)fVar1;
        dVar21 = (double)fVar4 - (double)fVar3;
        dVar20 = SQRT(dVar21 * dVar21 + dVar20 * dVar20 + dVar22 * dVar22);
        if (dVar20 < _x0 * 0.5) {
          *total_distance = dVar20 * 0.25 + *total_distance;
          dVar20 = (double)fVar1 * 0.25;
          iVar14 = *point_index;
          auVar8._8_4_ = SUB84(dVar20,0);
          auVar8._0_8_ = (double)fVar19 * 0.25;
          auVar8._12_4_ = (int)((ulong)dVar20 >> 0x20);
          *(undefined1 (*) [16])(draw_points + iVar14) = auVar8;
          dVar20 = (double)fVar2 * 0.25;
          auVar10._8_4_ = SUB84(dVar20,0);
          auVar10._0_8_ = (double)fVar3 * 0.25;
          auVar10._12_4_ = (int)((ulong)dVar20 >> 0x20);
          *(undefined1 (*) [16])(draw_points + (long)iVar14 + 2) = auVar10;
          dVar20 = (double)fVar4 * 0.25;
          *point_index = iVar14 + 6;
          auVar9._8_4_ = SUB84(dVar20,0);
          auVar9._0_8_ = (double)fVar5 * 0.25;
          auVar9._12_4_ = (int)((ulong)dVar20 >> 0x20);
          *(undefined1 (*) [16])(draw_points + (long)iVar14 + 4) = auVar9;
          *num_draw_points = *num_draw_points + 1;
          iVar14 = *draw_check;
          iVar6 = *draw_index;
          *draw_index = iVar6 + 1;
          draw_check_array[iVar6] = iVar14;
        }
        iVar14 = out->numberofvedges;
      }
      lVar13 = lVar13 + 1;
      lVar17 = lVar17 + 0x20;
    } while (lVar13 < iVar14);
  }
  return;
}

Assistant:

void V_unite_cube_extraction(tetgenio &out, int &draw_check, double &total_distance, double *draw_points, int *draw_check_array, int &num_draw_points,
							 float &x1, float &y1, float &z1, float &x2, float &y2, float &z2, int &draw_index, int &point_index)
{
	total_distance = 0;
	draw_index = 0;
	point_index = 0;
	num_draw_points = 0;
	double min_strut = 100;
	for (int i = 0; i < out.numberofvedges; i++)
	{
		x1 = out.vpointlist[3 * out.vedgelist[i].v1];
		y1 = out.vpointlist[3 * out.vedgelist[i].v1 + 1];
		z1 = out.vpointlist[3 * out.vedgelist[i].v1 + 2];

		if (out.vedgelist[i].v2 == -1.0)
		{
			x2 = out.vedgelist[i].vnormal[0];
			y2 = out.vedgelist[i].vnormal[1];
			z2 = out.vedgelist[i].vnormal[2];
			//cout<<"edge "<<i<<endl;
		}
		else
		{
			x2 = out.vpointlist[3 * out.vedgelist[i].v2];
			y2 = out.vpointlist[3 * out.vedgelist[i].v2 + 1];
			z2 = out.vpointlist[3 * out.vedgelist[i].v2 + 2];
		}

		// check if the line located inside the unit cube
		if ((x1 > 1.0 || y1 > 1.0 || z1 > 1.0 || x1 < 0.0 || y1 < 0.0 || z1 < 0.0) && (x2 > 1.0 || y2 > 1.0 || z2 > 1.0 || x2 < 0.0 || y2 < 0.0 || z2 < 0.0))
		{
		}
		else if ((out.vedgelist[i].v2 == -1.0) && (x1 >= 1.0 || y1 >= 1.0 || z1 >= 1.0 || x1 <= 0.0 || y1 <= 0.0 || z1 <= 0.0))
		{
		}
		else
		{
			int boundary = 0;
			trim(x1, y1, z1, x2, y2, z2, boundary, draw_check);

			if (dist_two_points_3d(x1, y1, z1, x2, y2, z2) < _x0 / 2)
			{
				if (dist_two_points_3d(x1, y1, z1, x2, y2, z2) * 0.25 < min_strut)
				{
					min_strut = dist_two_points_3d(x1, y1, z1, x2, y2, z2) * 0.25;
				}
				total_distance = total_distance + dist_two_points_3d(x1, y1, z1, x2, y2, z2) * 0.25;
				draw_points[point_index++] = x1 * 0.25;
				draw_points[point_index++] = y1 * 0.25;
				draw_points[point_index++] = z1 * 0.25;
				draw_points[point_index++] = x2 * 0.25;
				draw_points[point_index++] = y2 * 0.25;
				draw_points[point_index++] = z2 * 0.25;
				num_draw_points++;
				draw_check_array[draw_index++] = draw_check;
			}
		}
	}
}